

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

float __thiscall nv::Filter::sampleBox(Filter *this,float x,float scale,int samples)

{
  int iVar1;
  float fVar2;
  float extraout_XMM0_Da;
  
  if (samples < 1) {
    fVar2 = 0.0;
  }
  else {
    iVar1 = 0;
    fVar2 = 0.0;
    do {
      (*this->_vptr_Filter[2])((((float)iVar1 + 0.5) * (1.0 / (float)samples) + x) * scale,this);
      fVar2 = fVar2 + extraout_XMM0_Da;
      iVar1 = iVar1 + 1;
    } while (samples != iVar1);
  }
  return (1.0 / (float)samples) * fVar2;
}

Assistant:

float Filter::sampleBox(float x, float scale, int samples) const
{
	float sum = 0;
	float isamples = 1.0f / float(samples);

	for(int s = 0; s < samples; s++)
	{
		float p = (x + (float(s) + 0.5f) * isamples) * scale;
		float value = evaluate(p);
		sum += value;
	}
	
	return sum * isamples;
}